

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hpp
# Opt level: O2

difference_type
ft::distance<ft::treeIterator<int,ft::allocator<ft::treeNode<int>>>>
          (treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first,
          treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *last,type *param_3)

{
  difference_type dVar1;
  undefined **local_38;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *local_30;
  treeNode<int> *local_28;
  undefined **local_20;
  RBTree<int,_ft::allocator<ft::treeNode<int>_>_> *local_18;
  treeNode<int> *local_10;
  
  local_38 = &PTR__treeIterator_0010dcf0;
  local_30 = first->m_tree;
  local_28 = first->m_node;
  local_20 = &PTR__treeIterator_0010dcf0;
  local_18 = last->m_tree;
  local_10 = last->m_node;
  dVar1 = _distance<ft::treeIterator<int,ft::allocator<ft::treeNode<int>>>>(&local_38,&local_20);
  return dVar1;
}

Assistant:

typename ft::iterator_traits<InputIter>::difference_type
	distance(InputIter first, InputIter last,
			 typename ft::_void_t<typename ft::iterator_traits<InputIter>::iterator_category>::type * = 0) {
	return ft::_distance(first, last, typename ft::iterator_traits<InputIter>::iterator_category());
}